

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

void zap_dig(schar dx,schar dy,schar dz)

{
  undefined1 *puVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  monst *mon;
  level *plVar6;
  boolean bVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  obj *obj;
  xchar x;
  uint uVar12;
  char *pcVar13;
  xchar y;
  uint y_00;
  permonst *mdat;
  int iVar14;
  int iVar15;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char cVar16;
  
  mon = u.ustuck;
  if ((u._1052_1_ & 1) == 0) {
    if (dz == '\0') {
      cVar16 = true;
      if (((level->flags).field_0xa & 2) != 0) {
        bVar7 = on_level(&u.uz,&dungeon_topology.d_earth_level);
        cVar16 = bVar7 != '\0';
      }
      uVar10 = (uint)u.ux;
      y_00 = (uint)u.uy;
      uVar12 = mt_random();
      tmp_at(-1,0x40001);
      iVar14 = uVar12 % 0x12 + 7;
      bVar4 = false;
      bVar5 = false;
      iVar9 = uVar12 % 0x12 + 8;
      do {
        plVar6 = level;
        uVar10 = uVar10 + (int)dx;
        y_00 = y_00 + (int)dy;
        if ((0x4e < uVar10 - 1) || (0x14 < y_00)) break;
        tmp_at(uVar10,y_00);
        (*windowprocs.win_delay)();
        bVar7 = closed_door(level,uVar10,y_00);
        x = (xchar)uVar10;
        y = (xchar)y_00;
        if ((bVar7 != '\0') || (bVar2 = plVar6->locations[uVar10][y_00].typ, bVar2 == 0xf)) {
          iVar14 = artifact_door(level,uVar10,y_00);
          if (iVar14 == 0) {
            pcVar13 = in_rooms(level,x,y,0x12);
            if (*pcVar13 != '\0') {
              add_damage(x,y,400);
              bVar5 = true;
            }
            if (plVar6->locations[uVar10][y_00].typ == '\x0f') {
              plVar6->locations[uVar10][y_00].typ = '\x17';
            }
            else if ((viz_array[y_00][uVar10] & 2U) != 0) {
              pline("The door is razed!");
            }
            watch_dig((monst *)0x0,x,y,'\x01');
            puVar1 = &plVar6->locations[uVar10][y_00].field_0x6;
            *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
LAB_001668eb:
            unblock_point(uVar10,y_00);
            iVar15 = iVar9 + -3;
            goto LAB_00166906;
          }
          if ((viz_array[y_00][uVar10] & 2U) != 0) {
            pcVar13 = "The door glows then fades.";
LAB_00166b35:
            pline(pcVar13);
          }
          break;
        }
        iVar15 = iVar14;
        if (cVar16 == '\0') {
          if ('\f' < (char)bVar2 || bVar2 == 0) {
            if ((bVar2 == 0xd) ||
               ((bVar2 == 0 && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0)))) {
              if ((plVar6->locations[uVar10][y_00].field_0x6 & 0x80) == 0) {
                plVar6->locations[uVar10][y_00].typ = '\x19';
LAB_00166a85:
                unblock_point(uVar10,y_00);
                iVar15 = iVar9 + -3;
                goto LAB_00166906;
              }
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00166d34;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00166d2b;
              }
              else {
LAB_00166d2b:
                if (ublindf == (obj *)0x0) break;
LAB_00166d34:
                if (ublindf->oartifact != '\x1d') break;
              }
              pcVar13 = "The tree shudders but is unharmed.";
              goto LAB_00166b35;
            }
            if ((bVar2 & 0xef) != 0) goto LAB_00166906;
            if ((plVar6->locations[uVar10][y_00].field_0x6 & 0x80) == 0) {
              plVar6->locations[uVar10][y_00].typ = '\x18';
              goto LAB_00166a85;
            }
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00166db7;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00166dae;
            }
            else {
LAB_00166dae:
              if (ublindf == (obj *)0x0) break;
LAB_00166db7:
              if (ublindf->oartifact != '\x1d') break;
            }
            pcVar13 = "The rock glows then fades.";
            goto LAB_00166b35;
          }
          if ((plVar6->locations[uVar10][y_00].field_0x6 & 0x80) == 0) {
            pcVar13 = in_rooms(level,x,y,0x12);
            if (*pcVar13 != '\0') {
              add_damage(x,y,200);
              bVar4 = true;
            }
            plVar6->locations[uVar10][y_00].typ = '\x19';
            goto LAB_001668eb;
          }
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00166d05;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00166cfc;
          }
          else {
LAB_00166cfc:
            if (ublindf == (obj *)0x0) break;
LAB_00166d05:
            if (ublindf->oartifact != '\x1d') break;
          }
          pcVar13 = "The wall glows then fades.";
          goto LAB_00166b35;
        }
        if ('\x10' < (char)bVar2) goto LAB_00166906;
        bVar7 = may_dig(level,x,y);
        if (bVar7 == '\0') break;
        cVar3 = plVar6->locations[uVar10][y_00].typ;
        if (cVar3 == '\0' || '\f' < cVar3) {
          if (cVar3 == '\r') {
LAB_00166ad5:
            plVar6->locations[uVar10][y_00].typ = '\x19';
            iVar14 = -3;
          }
          else {
            if (cVar3 == '\x0f') goto LAB_0016697a;
            if ((cVar3 == '\0') && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0))
            goto LAB_00166ad5;
            plVar6->locations[uVar10][y_00].typ = '\x18';
            iVar14 = -2;
          }
        }
        else {
LAB_0016697a:
          pcVar13 = in_rooms(level,x,y,0x12);
          if (*pcVar13 != '\0') {
            add_damage(x,y,200);
            bVar4 = true;
          }
          watch_dig((monst *)0x0,x,y,'\x01');
          if ((((level->flags).field_0xa & 8) == 0) || (bVar7 = in_town(uVar10,y_00), bVar7 != '\0')
             ) {
            plVar6->locations[uVar10][y_00].typ = '\x17';
            puVar1 = &plVar6->locations[uVar10][y_00].field_0x6;
            *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
          }
          else {
            plVar6->locations[uVar10][y_00].typ = '\x18';
          }
          iVar14 = -3;
        }
        unblock_point(uVar10,y_00);
        iVar15 = iVar9 + iVar14;
LAB_00166906:
        iVar14 = iVar15 + -1;
        iVar9 = iVar15;
      } while (0 < iVar15);
      tmp_at(-6,0);
      if (bVar4 || bVar5) {
        pcVar13 = "dig into";
        if (bVar5) {
          pcVar13 = "destroy";
        }
        pay_for_damage(pcVar13,'\0');
        return;
      }
    }
    else {
      bVar7 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar7 == '\0') &&
          (bVar7 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar7 == '\0')) &&
         ((u._1052_1_ & 2) == 0)) {
        if ((-1 < dz) && (bVar7 = On_stairs(u.ux,u.uy), bVar7 == '\0')) {
          watch_dig((monst *)0x0,u.ux,u.uy,'\x01');
          dighole('\0');
          return;
        }
        bVar7 = On_stairs(u.ux,u.uy);
        if (bVar7 != '\0') {
          if (u.ux == (level->dnladder).sx) {
            pcVar13 = "ladder";
          }
          else {
            pcVar13 = "stairs";
            if (u.ux == (level->upladder).sx) {
              pcVar13 = "ladder";
            }
          }
          pcVar11 = ceiling((int)u.ux,(int)u.uy);
          pline("The beam bounces off the %s and hits the %s.",pcVar13,pcVar11);
        }
        pcVar13 = ceiling((int)u.ux,(int)u.uy);
        pline("You loosen a rock from the %s.",pcVar13);
        pcVar13 = body_part(8);
        pline("It falls on your %s!",pcVar13);
        uVar12 = 6;
        if ((uarmh != (obj *)0x0) &&
           (uVar8 = *(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f, 10 < uVar8)) {
          uVar12 = (uint)(0x11 < uVar8) * 4 + 2;
        }
        uVar10 = mt_random();
        losehp(uVar10 % uVar12 + 1,"falling rock",0);
        obj = mksobj_at(0x213,level,(int)u.ux,(int)u.uy,'\0','\0');
        if (obj != (obj *)0x0) {
          xname(obj);
          stackobj((obj *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        }
        newsym((int)u.ux,(int)u.uy);
        return;
      }
    }
  }
  else {
    mdat = (u.ustuck)->data;
    if (mdat != mons + 0x9f && mdat->mlet != '\x16') {
      if ((mdat->mflags1 & 0x40000) != 0) {
        pcVar13 = mon_nam(u.ustuck);
        pcVar13 = s_suffix(pcVar13);
        pcVar11 = mbodypart(mon,0x12);
        pline("You pierce %s %s wall!",pcVar13,pcVar11);
        mdat = mon->data;
      }
      iVar9 = 1;
      if (mdat == mons + 0x13b) {
        iVar9 = (mon->mhp - (mon->mhp + 1 >> 0x1f)) + 1 >> 1;
      }
      mon->mhp = iVar9;
      expels(mon,mdat,(mdat->mflags1 >> 0x12 & 1) == 0);
      return;
    }
  }
  return;
}

Assistant:

void zap_dig(schar dx, schar dy, schar dz)
{
	struct rm *room;
	struct monst *mtmp;
	struct obj *otmp;
	int zx, zy, digdepth;
	boolean shopdoor, shopwall, maze_dig;

	if (u.uswallow) {
	    mtmp = u.ustuck;

	    if (!is_whirly(mtmp->data)) {
		if (is_animal(mtmp->data))
		    pline("You pierce %s %s wall!",
			s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));

		/* Juiblex takes less damage from a wand of digging. */
		if (mtmp->data == &mons[PM_JUIBLEX])
		    mtmp->mhp = (mtmp->mhp + 1) / 2;
		else
		    mtmp->mhp = 1;		/* almost dead */

		expels(mtmp, mtmp->data, !is_animal(mtmp->data));
	    }
	    return;
	} /* swallowed */

	if (dz) {
	    if (!Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz) && !Underwater) {
		if (dz < 0 || On_stairs(u.ux, u.uy)) {
		    if (On_stairs(u.ux, u.uy))
			pline("The beam bounces off the %s and hits the %s.",
			      (u.ux == level->dnladder.sx || u.ux == level->upladder.sx) ?
			      "ladder" : "stairs", ceiling(u.ux, u.uy));
		    pline("You loosen a rock from the %s.", ceiling(u.ux, u.uy));
		    pline("It falls on your %s!", body_part(HEAD));
		    losehp(rnd((uarmh && is_metallic(uarmh)) ? 2 : 6),
			   "falling rock", KILLED_BY_AN);
		    otmp = mksobj_at(ROCK, level, u.ux, u.uy, FALSE, FALSE);
		    if (otmp) {
			xname(otmp);	/* set dknown, maybe bknown */
			stackobj(otmp);
		    }
		    newsym(u.ux, u.uy);
		} else {
		    watch_dig(NULL, u.ux, u.uy, TRUE);
		    dighole(FALSE);
		}
	    }
	    return;
	} /* up or down */

	/* normal case: digging across the level */
	shopdoor = shopwall = FALSE;
	maze_dig = level->flags.is_maze_lev && !Is_earthlevel(&u.uz);
	zx = u.ux + dx;
	zy = u.uy + dy;
	digdepth = rn1(18, 8);
	tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_digbeam));
	while (--digdepth >= 0) {
	    if (!isok(zx,zy)) break;
	    room = &level->locations[zx][zy];
	    tmp_at(zx,zy);
	    win_delay_output();	/* wait a little bit */
	    if (closed_door(level, zx, zy) || room->typ == SDOOR) {
		/* ALI - Artifact doors */
		if (artifact_door(level, zx, zy)) {
		    if (cansee(zx, zy))
			pline("The door glows then fades.");
		    break;
		}
		if (*in_rooms(level, zx,zy,SHOPBASE)) {
		    add_damage(zx, zy, 400L);
		    shopdoor = TRUE;
		}
		if (room->typ == SDOOR)
		    room->typ = DOOR;
		else if (cansee(zx, zy))
		    pline("The door is razed!");
		watch_dig(NULL, zx, zy, TRUE);
		room->doormask = D_NODOOR;
		unblock_point(zx,zy); /* vision */
		digdepth -= 2;
	    } else if (maze_dig) {
		if (IS_WALL(room->typ)) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			if (*in_rooms(level, zx,zy,SHOPBASE)) {
			    add_damage(zx, zy, 200L);
			    shopwall = TRUE;
			}
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The wall glows then fades.");
			digdepth = 0;
		    }
		} else if (IS_TREE(level, room->typ)) { /* check trees before stone */
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The tree shudders but is unharmed.");
			digdepth = 0;
		    }
		} else if (room->typ == STONE || room->typ == SCORR) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = CORR;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The rock glows then fades.");
			digdepth = 0;
		    }
		}
	    } else if (IS_ROCK(room->typ)) {
		if (!may_dig(level, zx,zy)) break;
		if (IS_WALL(room->typ) || room->typ == SDOOR) {
		    if (*in_rooms(level, zx,zy,SHOPBASE)) {
			add_damage(zx, zy, 200L);
			shopwall = TRUE;
		    }
		    watch_dig(NULL, zx, zy, TRUE);
		    if (level->flags.is_cavernous_lev && !in_town(zx, zy)) {
			room->typ = CORR;
		    } else {
			room->typ = DOOR;
			room->doormask = D_NODOOR;
		    }
		    digdepth -= 2;
		} else if (IS_TREE(level, room->typ)) {
		    room->typ = ROOM;
		    digdepth -= 2;
		} else {	/* IS_ROCK but not IS_WALL or SDOOR */
		    room->typ = CORR;
		    digdepth--;
		}
		unblock_point(zx,zy); /* vision */
	    }
	    zx += dx;
	    zy += dy;
	} /* while */
	
	tmp_at(DISP_END, 0);	/* closing call */
	if (shopdoor || shopwall)
	    pay_for_damage(shopdoor ? "destroy" : "dig into", FALSE);
	return;
}